

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dmp_test.cpp
# Opt level: O2

void __thiscall diff_match_patch_test::testPatchObj(diff_match_patch_test *this)

{
  diff_match_patch_test *this_00;
  wstring *this_01;
  allocator<wchar_t> local_3ba;
  allocator<wchar_t> local_3b9;
  allocator<wchar_t> local_3b8;
  allocator<wchar_t> local_3b7;
  allocator<wchar_t> local_3b6;
  allocator<wchar_t> local_3b5;
  allocator<wchar_t> local_3b4;
  allocator<wchar_t> local_3b3;
  allocator<wchar_t> local_3b2;
  allocator<wchar_t> local_3b1;
  wstring local_3b0;
  wstring local_390;
  wstring local_370 [32];
  wstring local_350 [32];
  wstring local_330 [32];
  wstring local_310 [32];
  wstring local_2f0 [32];
  wstring local_2d0 [32];
  wstring local_2b0 [32];
  wstring local_290 [32];
  undefined1 local_270 [40];
  undefined1 local_248 [40];
  undefined1 local_220 [40];
  undefined1 local_1f8 [40];
  undefined1 local_1d0 [40];
  undefined1 local_1a8 [40];
  undefined1 local_180 [40];
  undefined1 local_158 [40];
  undefined1 local_130 [40];
  undefined1 local_108 [40];
  wstring strp;
  deque<Diff,_std::allocator<Diff>_> local_90;
  undefined8 local_40;
  undefined8 uStack_38;
  
  Patch::Patch((Patch *)&local_90);
  local_40 = 0x1500000014;
  uStack_38 = 0x1100000012;
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>((wstring *)&local_3b0,L"jump",&local_3b1);
  Diff::Diff((Diff *)local_1f8,Equal,(wstring *)&local_3b0);
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>((wstring *)&local_390,L"s",&local_3b2);
  Diff::Diff((Diff *)local_220,Delete,(wstring *)&local_390);
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>(local_370,L"ed",&local_3b3);
  Diff::Diff((Diff *)local_248,Insert,local_370);
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>(local_290,L" over ",&local_3b4);
  Diff::Diff((Diff *)local_270,Equal,local_290);
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>(local_2b0,L"the",&local_3b5);
  Diff::Diff((Diff *)local_108,Delete,local_2b0);
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>(local_2d0,L"a",&local_3b6);
  Diff::Diff((Diff *)local_130,Insert,local_2d0);
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>(local_2f0,L"\nlaz",&local_3b7);
  Diff::Diff((Diff *)local_158,Equal,local_2f0);
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>(local_310,L"",&local_3b8);
  Diff::Diff((Diff *)local_180,Insert,local_310);
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>(local_330,L"",&local_3b9);
  Diff::Diff((Diff *)local_1a8,Insert,local_330);
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>(local_350,L"",&local_3ba);
  this_00 = (diff_match_patch_test *)0x1;
  Diff::Diff((Diff *)local_1d0,Insert,local_350);
  diffList((deque<Diff,_std::allocator<Diff>_> *)&strp,this_00,(Diff *)local_1f8,(Diff *)local_220,
           (Diff *)local_248,(Diff *)local_270,(Diff *)local_108,(Diff *)local_130,(Diff *)local_158
           ,(Diff *)local_180,(Diff *)local_1a8,(Diff *)local_1d0);
  std::deque<Diff,_std::allocator<Diff>_>::_M_move_assign1(&local_90,&strp);
  std::deque<Diff,_std::allocator<Diff>_>::~deque((deque<Diff,_std::allocator<Diff>_> *)&strp);
  std::__cxx11::wstring::~wstring((wstring *)(local_1d0 + 8));
  std::__cxx11::wstring::~wstring(local_350);
  std::__cxx11::wstring::~wstring((wstring *)(local_1a8 + 8));
  std::__cxx11::wstring::~wstring(local_330);
  std::__cxx11::wstring::~wstring((wstring *)(local_180 + 8));
  std::__cxx11::wstring::~wstring(local_310);
  std::__cxx11::wstring::~wstring((wstring *)(local_158 + 8));
  std::__cxx11::wstring::~wstring(local_2f0);
  std::__cxx11::wstring::~wstring((wstring *)(local_130 + 8));
  std::__cxx11::wstring::~wstring(local_2d0);
  std::__cxx11::wstring::~wstring((wstring *)(local_108 + 8));
  std::__cxx11::wstring::~wstring(local_2b0);
  std::__cxx11::wstring::~wstring((wstring *)(local_270 + 8));
  std::__cxx11::wstring::~wstring(local_290);
  std::__cxx11::wstring::~wstring((wstring *)(local_248 + 8));
  std::__cxx11::wstring::~wstring(local_370);
  std::__cxx11::wstring::~wstring((wstring *)(local_220 + 8));
  std::__cxx11::wstring::~wstring((wstring *)&local_390);
  std::__cxx11::wstring::~wstring((wstring *)(local_1f8 + 8));
  std::__cxx11::wstring::~wstring((wstring *)&local_3b0);
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>
            ((wstring *)&strp,L"@@ -21,18 +22,17 @@\n jump\n-s\n+ed\n  over \n-the\n+a\n %0Alaz\n",
             (allocator<wchar_t> *)&local_3b0);
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>
            ((wstring *)&local_3b0,L"Patch: toString.",(allocator<wchar_t> *)local_370);
  this_01 = &local_390;
  Patch::toString_abi_cxx11_();
  assertEquals((diff_match_patch_test *)this_01,&local_3b0,&strp,&local_390);
  std::__cxx11::wstring::~wstring((wstring *)&local_390);
  std::__cxx11::wstring::~wstring((wstring *)&local_3b0);
  std::__cxx11::wstring::~wstring((wstring *)&strp);
  std::deque<Diff,_std::allocator<Diff>_>::~deque(&local_90);
  return;
}

Assistant:

void diff_match_patch_test::testPatchObj() {
  // Patch Object.
  Patch p;
  p.start1 = 20;
  p.start2 = 21;
  p.length1 = 18;
  p.length2 = 17;
  p.diffs = diffList(Diff(Diff::Operation::Equal, L"jump"), Diff(Diff::Operation::Delete, L"s"), Diff(Diff::Operation::Insert, L"ed"), Diff(Diff::Operation::Equal, L" over "), Diff(Diff::Operation::Delete, L"the"), Diff(Diff::Operation::Insert, L"a"), Diff(Diff::Operation::Equal, L"\nlaz"));
  std::wstring strp = L"@@ -21,18 +22,17 @@\n jump\n-s\n+ed\n  over \n-the\n+a\n %0Alaz\n";
  assertEquals(L"Patch: toString.", strp, p.toString());
}